

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cw-out.c
# Opt level: O0

CURLcode cw_out_append(cw_out_ctx *ctx,Curl_easy *data,cw_out_type otype,char *buf,size_t blen)

{
  size_t sVar1;
  cw_out_buf *pcVar2;
  cw_out_buf *cwbuf;
  size_t blen_local;
  char *buf_local;
  cw_out_type otype_local;
  Curl_easy *data_local;
  cw_out_ctx *ctx_local;
  
  if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x894 >> 0x1e & 1) != 0)) &&
      (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))) &&
     (0 < Curl_trc_feat_write.log_level)) {
    sVar1 = cw_out_bufs_len(ctx);
    Curl_trc_write(data,"[OUT] paused, buffering %zu more bytes (%zu/%d)",blen,sVar1,0x4000000);
  }
  sVar1 = cw_out_bufs_len(ctx);
  if (sVar1 + blen < 0x4000001) {
    if (((ctx->buf == (cw_out_buf *)0x0) || (ctx->buf->type != otype)) || (otype == CW_OUT_HDS)) {
      pcVar2 = cw_out_buf_create(otype);
      if (pcVar2 == (cw_out_buf *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      pcVar2->next = ctx->buf;
      ctx->buf = pcVar2;
    }
    ctx_local._4_4_ = Curl_dyn_addn(&ctx->buf->b,buf,blen);
  }
  else {
    Curl_failf(data,"pause buffer not large enough -> CURLE_TOO_LARGE");
    ctx_local._4_4_ = CURLE_TOO_LARGE;
  }
  return ctx_local._4_4_;
}

Assistant:

static CURLcode cw_out_append(struct cw_out_ctx *ctx,
                              struct Curl_easy *data,
                              cw_out_type otype,
                              const char *buf, size_t blen)
{
  CURL_TRC_WRITE(data, "[OUT] paused, buffering %zu more bytes (%zu/%d)",
                 blen, cw_out_bufs_len(ctx), DYN_PAUSE_BUFFER);
  if(cw_out_bufs_len(ctx) + blen > DYN_PAUSE_BUFFER) {
    failf(data, "pause buffer not large enough -> CURLE_TOO_LARGE");
    return CURLE_TOO_LARGE;
  }

  /* if we do not have a buffer, or it is of another type, make a new one.
   * And for CW_OUT_HDS always make a new one, so we "replay" headers
   * exactly as they came in */
  if(!ctx->buf || (ctx->buf->type != otype) || (otype == CW_OUT_HDS)) {
    struct cw_out_buf *cwbuf = cw_out_buf_create(otype);
    if(!cwbuf)
      return CURLE_OUT_OF_MEMORY;
    cwbuf->next = ctx->buf;
    ctx->buf = cwbuf;
  }
  DEBUGASSERT(ctx->buf && (ctx->buf->type == otype));
  return Curl_dyn_addn(&ctx->buf->b, buf, blen);
}